

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

Decompiler * __thiscall
r_comp::Decompiler::get_variable_name_abi_cxx11_(Decompiler *this,uint16_t index,bool postfix)

{
  bool bVar1;
  mapped_type *this_00;
  pointer ppVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  undefined8 *puVar3;
  char local_168 [8];
  char buffer [255];
  _Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_60 [3];
  _Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_48;
  iterator it;
  string s;
  ushort local_1a;
  bool postfix_local;
  undefined8 *puStack_18;
  uint16_t index_local;
  Decompiler *this_local;
  
  puVar3 = (undefined8 *)CONCAT62(in_register_00000032,index);
  local_1a = (ushort)CONCAT71(in_register_00000011,postfix);
  puStack_18 = puVar3;
  this_local = this;
  std::__cxx11::string::string((string *)&it);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(puVar3 + 6),&local_1a);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(puVar3 + 6));
  bVar1 = std::__detail::operator==(&local_48,local_60);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&it,"v");
    *(short *)(puVar3 + 0xd) = *(short *)(puVar3 + 0xd) + 1;
    sprintf(local_168,"%d");
    std::__cxx11::string::operator+=((string *)&it,local_168);
    this_00 = std::
              unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(puVar3 + 6),&local_1a);
    std::__cxx11::string::operator=((string *)this_00,(string *)&it);
    if ((in_CL & 1) != 0) {
      std::__cxx11::string::operator+=((string *)&it,':');
    }
    OutStream::insert<std::__cxx11::string>
              ((OutStream *)*puVar3,(ulong)local_1a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    if ((in_CL & 1) == 0) {
      std::__cxx11::string::string((string *)this,(string *)&it);
    }
    else {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)this,(ulong)&it);
    }
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_48);
    std::__cxx11::string::string((string *)this,(string *)&ppVar2->second);
  }
  std::__cxx11::string::~string((string *)&it);
  return this;
}

Assistant:

std::string Decompiler::get_variable_name(uint16_t index, bool postfix)
{
    std::string s;
    std::unordered_map<uint16_t, std::string>::iterator it = variable_names.find(index);

    if (it == variable_names.end()) {
        char buffer[255];
        s = "v";
        sprintf(buffer, "%d", last_variable_id++);
        s += buffer;
        variable_names[index] = s;

        if (postfix) {
            s += ':';
        }

        out_stream->insert(index, s);

        if (postfix) {
            return s.substr(0, s.length() - 1);
        }

        return s;
    }

    return it->second;
}